

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int channel_start(mixed_segment *segment)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  pvVar3 = segment->data;
  if ((ulong)*(byte *)((long)pvVar3 + 0xe0) != 0) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      if (*(long *)((long)pvVar3 + uVar4 * 8) == 0) goto LAB_00132273;
      uVar4 = uVar4 + 1;
    } while (*(byte *)((long)pvVar3 + 0xe0) != uVar4);
  }
  uVar4 = (ulong)*(byte *)((long)pvVar3 + 0xe1);
  uVar5 = 1;
  if (uVar4 != 0) {
    if (*(long *)((long)pvVar3 + 0x70) == 0) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar4 - 1 == uVar6) {
          return 1;
        }
        uVar1 = uVar6 + 1;
        lVar2 = uVar6 * 8;
        uVar6 = uVar1;
      } while (*(long *)((long)pvVar3 + lVar2 + 0x78) != 0);
      uVar5 = (uint)(uVar4 <= uVar1);
    }
LAB_00132273:
    mixed_err(0x16);
  }
  return uVar5;
}

Assistant:

int channel_start(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  for(mixed_channel_t i=0; i<data->in_channels; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->out_channels; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}